

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_params.h
# Opt level: O2

string * __thiscall
google::protobuf::compiler::javanano::Params::java_package(Params *this,string *file_name)

{
  const_iterator cVar1;
  Params *pPVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->java_packages_)._M_t,file_name);
  pPVar2 = (Params *)(cVar1._M_node + 2);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->java_packages_)._M_t._M_impl.super__Rb_tree_header
     ) {
    pPVar2 = this;
  }
  return &pPVar2->empty_;
}

Assistant:

const string& java_package(const string& file_name) const {
    NameMap::const_iterator itr;

    itr = java_packages_.find(file_name);
    if  (itr == java_packages_.end()) {
      return empty_;
    } else {
      return itr->second;
    }
  }